

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cellml_1_1.cpp
# Opt level: O0

void __thiscall
ImporterStrict_sineCellml11ImportInStrictMode_Test::
~ImporterStrict_sineCellml11ImportInStrictMode_Test
          (ImporterStrict_sineCellml11ImportInStrictMode_Test *this)

{
  ImporterStrict_sineCellml11ImportInStrictMode_Test *this_local;
  
  ~ImporterStrict_sineCellml11ImportInStrictMode_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ImporterStrict, sineCellml11ImportInStrictMode)
{
    const std::vector<std::string> expectedImporterIssues = {
        "Import of component 'actual_sin' from '" + resourcePath("cellml1X/sin.xml") + "' requires component named 'sin' which cannot be found.",
        "Import of component 'deriv_approx_sin' from '" + resourcePath("cellml1X/deriv_approx_sin.xml") + "' requires component named 'sin' which cannot be found.",
        "Import of component 'parabolic_approx_sin' from '" + resourcePath("cellml1X/parabolic_approx_sin.xml") + "' requires component named 'sin' which cannot be found.",
    };

    libcellml::ParserPtr parser = libcellml::Parser::create(false);
    libcellml::ImporterPtr importer = libcellml::Importer::create();
    auto model = parser->parseModel(fileContents("cellml1X/sin_approximations_import.xml"));

    EXPECT_EQ(size_t(3), parser->issueCount());
    EXPECT_EQ_ISSUES(expectedParserIssues, parser);
    EXPECT_TRUE(model->hasUnresolvedImports());

    importer->resolveImports(model, resourcePath("cellml1X"));
    EXPECT_EQ(size_t(3), importer->issueCount());
    EXPECT_EQ_ISSUES(expectedImporterIssues, importer);
    EXPECT_TRUE(model->hasUnresolvedImports());
}